

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

void __thiscall cmFileInstaller::ReportCopy(cmFileInstaller *this,char *toFile,Type type,bool copy)

{
  char *pcVar1;
  string message;
  allocator local_39;
  string local_38;
  
  if (this->MessageNever == false) {
    if (copy) {
      pcVar1 = "Installing: ";
    }
    else {
      if (this->MessageLazy != false) goto LAB_003b41fa;
      pcVar1 = "Up-to-date: ";
    }
    std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
    std::__cxx11::string::append((char *)&local_38);
    cmMakefile::DisplayStatus((this->super_cmFileCopier).Makefile,local_38._M_dataplus._M_p,-1.0);
    std::__cxx11::string::~string((string *)&local_38);
  }
LAB_003b41fa:
  if (type != TypeDir) {
    std::__cxx11::string::string((string *)&local_38,toFile,&local_39);
    ManifestAppend(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

virtual void ReportCopy(const char* toFile, Type type, bool copy)
    {
    if(!this->MessageNever && (copy || !this->MessageLazy))
      {
      std::string message = (copy? "Installing: " : "Up-to-date: ");
      message += toFile;
      this->Makefile->DisplayStatus(message.c_str(), -1);
      }
    if(type != TypeDir)
      {
      // Add the file to the manifest.
      this->ManifestAppend(toFile);
      }
    }